

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::iterate
          (TransformFeedbackCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  char *str;
  MessageBuilder *pMVar5;
  Array<const_deqp::gles3::Functional::TransformFeedback::DrawCall_*> local_320;
  MessageBuilder local_310;
  ScopedLogSection local_190;
  ScopedLogSection section;
  int local_164;
  string local_160;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string sectionDesc;
  string local_b0;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string sectionName;
  DrawCall *end;
  DrawCall *first;
  uint local_30;
  int numIterations;
  deUint32 seed;
  bool isOk;
  TestLog *log;
  TransformFeedbackCase *local_10;
  TransformFeedbackCase *this_local;
  
  local_10 = this;
  if ((iterate()::s_elemCount1 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_elemCount1), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_elemCount1,1,true);
    __cxa_guard_release(&iterate()::s_elemCount1);
  }
  if ((iterate()::s_elemCount2 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_elemCount2), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_elemCount2,2,true);
    __cxa_guard_release(&iterate()::s_elemCount2);
  }
  if ((iterate()::s_elemCount3 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_elemCount3), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_elemCount3,3,true);
    __cxa_guard_release(&iterate()::s_elemCount3);
  }
  if ((iterate()::s_elemCount4 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_elemCount4), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_elemCount4,4,true);
    __cxa_guard_release(&iterate()::s_elemCount4);
  }
  if ((iterate()::s_elemCount123 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_elemCount123), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_elemCount123,0x7b,true);
    __cxa_guard_release(&iterate()::s_elemCount123);
  }
  if ((iterate()::s_basicPause1 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_basicPause1), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_basicPause1,0x40,true);
    DrawCall::DrawCall(iterate::s_basicPause1 + 1,0x40,false);
    DrawCall::DrawCall(iterate::s_basicPause1 + 2,0x40,true);
    __cxa_guard_release(&iterate()::s_basicPause1);
  }
  if ((iterate()::s_basicPause2 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_basicPause2), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_basicPause2,0xd,true);
    DrawCall::DrawCall(iterate::s_basicPause2 + 1,5,true);
    DrawCall::DrawCall(iterate::s_basicPause2 + 2,0x11,false);
    DrawCall::DrawCall(iterate::s_basicPause2 + 3,3,true);
    DrawCall::DrawCall(iterate::s_basicPause2 + 4,7,false);
    __cxa_guard_release(&iterate()::s_basicPause2);
  }
  if ((iterate()::s_startPaused == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_startPaused), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_startPaused,0x7b,false);
    DrawCall::DrawCall(iterate::s_startPaused + 1,0x7b,true);
    __cxa_guard_release(&iterate()::s_startPaused);
  }
  if ((iterate()::s_random1 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_random1), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_random1,0x41,true);
    DrawCall::DrawCall(iterate::s_random1 + 1,0x87,false);
    DrawCall::DrawCall(iterate::s_random1 + 2,0x4a,true);
    DrawCall::DrawCall(iterate::s_random1 + 3,0x10,false);
    DrawCall::DrawCall(iterate::s_random1 + 4,0xe2,false);
    DrawCall::DrawCall(iterate::s_random1 + 5,9,true);
    DrawCall::DrawCall(iterate::s_random1 + 6,0xae,false);
    __cxa_guard_release(&iterate()::s_random1);
  }
  if ((iterate()::s_random2 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::s_random2), iVar2 != 0)) {
    DrawCall::DrawCall(iterate::s_random2,0xd9,true);
    DrawCall::DrawCall(iterate::s_random2 + 1,0xab,true);
    DrawCall::DrawCall(iterate::s_random2 + 2,0x93,true);
    DrawCall::DrawCall(iterate::s_random2 + 3,0x98,false);
    DrawCall::DrawCall(iterate::s_random2 + 4,0x37,true);
    __cxa_guard_release(&iterate()::s_random2);
  }
  _seed = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  numIterations._3_1_ = 1;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  dVar4 = ::deInt32Hash(this->m_iterNdx);
  local_30 = dVar3 ^ dVar4;
  first._4_4_ = 10;
  end = iterate::s_iterations[this->m_iterNdx].calls;
  sectionName.field_2._8_8_ =
       iterate::s_iterations[this->m_iterNdx].calls +
       iterate::s_iterations[this->m_iterNdx].numCalls;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Iteration",&local_89);
  sectionDesc.field_2._12_4_ = this->m_iterNdx + 1;
  de::toString<int>(&local_b0,(int *)(sectionDesc.field_2._M_local_buf + 0xc));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Iteration ",&local_139);
  local_164 = this->m_iterNdx + 1;
  de::toString<int>(&local_160,&local_164);
  std::operator+(&local_118,&local_138,&local_160);
  std::operator+(&local_f8,&local_118," / ");
  de::toString<int>((string *)&section,(int *)((long)&first + 4));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 &local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  tcu::ScopedLogSection::ScopedLogSection(&local_190,_seed,(string *)local_68,(string *)local_d8);
  tcu::TestLog::operator<<(&local_310,_seed,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_310,(char (*) [9])"Testing ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&iterate::s_iterations[this->m_iterNdx].numCalls);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [41])" draw calls, (element count, TF state): ");
  local_320 = tcu::formatArray<deqp::gles3::Functional::TransformFeedback::DrawCall_const*>
                        (&end,(DrawCall **)((long)&sectionName.field_2 + 8));
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_320);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_310);
  numIterations._3_1_ = runTest(this,end,(DrawCall *)sectionName.field_2._8_8_,local_30);
  if (!(bool)numIterations._3_1_) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Result comparison failed");
  }
  this->m_iterNdx = this->m_iterNdx + 1;
  bVar1 = false;
  if ((numIterations._3_1_ & 1) != 0) {
    bVar1 = this->m_iterNdx < first._4_4_;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_190);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_68);
  return (uint)bVar1;
}

Assistant:

TransformFeedbackCase::IterateResult TransformFeedbackCase::iterate (void)
{
	// Test cases.
	static const DrawCall s_elemCount1[]	= { DrawCall(1, true) };
	static const DrawCall s_elemCount2[]	= { DrawCall(2, true) };
	static const DrawCall s_elemCount3[]	= { DrawCall(3, true) };
	static const DrawCall s_elemCount4[]	= { DrawCall(4, true) };
	static const DrawCall s_elemCount123[]	= { DrawCall(123, true) };
	static const DrawCall s_basicPause1[]	= { DrawCall(64, true), DrawCall(64, false), DrawCall(64, true) };
	static const DrawCall s_basicPause2[]	= { DrawCall(13, true), DrawCall(5, true), DrawCall(17, false), DrawCall(3, true), DrawCall(7, false) };
	static const DrawCall s_startPaused[]	= { DrawCall(123, false), DrawCall(123, true) };
	static const DrawCall s_random1[]		= { DrawCall(65, true), DrawCall(135, false), DrawCall(74, true), DrawCall(16, false), DrawCall(226, false), DrawCall(9, true), DrawCall(174, false) };
	static const DrawCall s_random2[]		= { DrawCall(217, true), DrawCall(171, true), DrawCall(147, true), DrawCall(152, false), DrawCall(55, true) };

	static const struct
	{
		const DrawCall*		calls;
		int					numCalls;
	} s_iterations[] =
	{
#define ITER(ARR) { ARR, DE_LENGTH_OF_ARRAY(ARR) }
		ITER(s_elemCount1),
		ITER(s_elemCount2),
		ITER(s_elemCount3),
		ITER(s_elemCount4),
		ITER(s_elemCount123),
		ITER(s_basicPause1),
		ITER(s_basicPause2),
		ITER(s_startPaused),
		ITER(s_random1),
		ITER(s_random2)
#undef ITER
	};

	TestLog&				log				= m_testCtx.getLog();
	bool					isOk			= true;
	deUint32				seed			= deStringHash(getName()) ^ deInt32Hash(m_iterNdx);
	int						numIterations	= DE_LENGTH_OF_ARRAY(s_iterations);
	const DrawCall*			first			= s_iterations[m_iterNdx].calls;
	const DrawCall*			end				= s_iterations[m_iterNdx].calls + s_iterations[m_iterNdx].numCalls;

	std::string				sectionName		= std::string("Iteration") + de::toString(m_iterNdx+1);
	std::string				sectionDesc		= std::string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(numIterations);
	tcu::ScopedLogSection	section			(log, sectionName, sectionDesc);

	log << TestLog::Message << "Testing " << s_iterations[m_iterNdx].numCalls << " draw calls, (element count, TF state): " << tcu::formatArray(first, end) << TestLog::EndMessage;

	isOk = runTest(first, end, seed);

	if (!isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result comparison failed");

	m_iterNdx += 1;
	return (isOk && m_iterNdx < numIterations) ? CONTINUE : STOP;
}